

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicslinearlayout.cpp
# Opt level: O0

void __thiscall
QGraphicsLinearLayout::removeItem(QGraphicsLinearLayout *this,QGraphicsLayoutItem *item)

{
  QGraphicsLinearLayoutPrivate *this_00;
  QGridLayoutItem *in_RDI;
  QGraphicsGridLayoutEngineItem *gridItem;
  QGraphicsLinearLayoutPrivate *d;
  QGraphicsLayoutItem *in_stack_ffffffffffffffc8;
  QGraphicsLayoutItem *in_stack_ffffffffffffffd0;
  
  d_func((QGraphicsLinearLayout *)0x9b7301);
  this_00 = (QGraphicsLinearLayoutPrivate *)
            QGraphicsGridLayoutEngine::findLayoutItem
                      ((QGraphicsGridLayoutEngine *)in_RDI,in_stack_ffffffffffffffd0);
  if (this_00 != (QGraphicsLinearLayoutPrivate *)0x0) {
    QGraphicsLayoutItem::setParentLayoutItem(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    QGraphicsLinearLayoutPrivate::removeGridItem(this_00,in_RDI);
    if (this_00 != (QGraphicsLinearLayoutPrivate *)0x0) {
      (*(this_00->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.
        _vptr_QGraphicsLayoutItemPrivate[1])();
    }
    (**(code **)(*(long *)in_RDI + 0x38))();
  }
  return;
}

Assistant:

void QGraphicsLinearLayout::removeItem(QGraphicsLayoutItem *item)
{
    Q_D(QGraphicsLinearLayout);
    if (QGraphicsGridLayoutEngineItem *gridItem = d->engine.findLayoutItem(item)) {
        item->setParentLayoutItem(nullptr);
        d->removeGridItem(gridItem);
        delete gridItem;
        invalidate();
    }
}